

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O1

void read_calendar_record
               (calendar_record_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  service_availability_t sVar2;
  ulong uVar3;
  char *pcVar4;
  calendar_record_t *__dest;
  
  record->service_id[0] = '\0';
  record->start_date[0] = '\0';
  record->end_date[0] = '\0';
  record->monday = SA_NOT_SET;
  record->tuesday = SA_NOT_SET;
  record->wednesday = SA_NOT_SET;
  record->thursday = SA_NOT_SET;
  record->friday = SA_NOT_SET;
  record->saturday = SA_NOT_SET;
  record->sunday = SA_NOT_SET;
  if (0 < field_count) {
    uVar3 = 0;
    do {
      pcVar4 = field_names[uVar3];
      iVar1 = strcmp(pcVar4,"service_id");
      if (iVar1 == 0) {
        pcVar4 = field_values[uVar3];
        __dest = record;
LAB_001057b9:
        strcpy(__dest->service_id,pcVar4);
      }
      else {
        iVar1 = strcmp(pcVar4,"start_date");
        if (iVar1 == 0) {
          pcVar4 = field_values[uVar3];
          __dest = (calendar_record_t *)record->start_date;
          goto LAB_001057b9;
        }
        iVar1 = strcmp(pcVar4,"end_date");
        if (iVar1 == 0) {
          pcVar4 = field_values[uVar3];
          __dest = (calendar_record_t *)record->end_date;
          goto LAB_001057b9;
        }
        iVar1 = strcmp(pcVar4,"monday");
        if (iVar1 == 0) {
          sVar2 = parse_service_availability(field_values[uVar3]);
          record->monday = sVar2;
        }
        else {
          iVar1 = strcmp(pcVar4,"tuesday");
          if (iVar1 == 0) {
            sVar2 = parse_service_availability(field_values[uVar3]);
            record->tuesday = sVar2;
          }
          else {
            iVar1 = strcmp(pcVar4,"wednesday");
            if (iVar1 == 0) {
              sVar2 = parse_service_availability(field_values[uVar3]);
              record->wednesday = sVar2;
            }
            else {
              iVar1 = strcmp(pcVar4,"thursday");
              if (iVar1 == 0) {
                sVar2 = parse_service_availability(field_values[uVar3]);
                record->thursday = sVar2;
              }
              else {
                iVar1 = strcmp(pcVar4,"friday");
                if (iVar1 == 0) {
                  sVar2 = parse_service_availability(field_values[uVar3]);
                  record->friday = sVar2;
                }
                else {
                  iVar1 = strcmp(pcVar4,"saturday");
                  if (iVar1 == 0) {
                    sVar2 = parse_service_availability(field_values[uVar3]);
                    record->saturday = sVar2;
                  }
                  else {
                    iVar1 = strcmp(pcVar4,"sunday");
                    if (iVar1 == 0) {
                      sVar2 = parse_service_availability(field_values[uVar3]);
                      record->sunday = sVar2;
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)field_count != uVar3);
  }
  return;
}

Assistant:

void read_calendar_record(calendar_record_t *record, int field_count, const char **field_names, const char **field_values) {
    init_calendar_record(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "start_date") == 0) {
            strcpy(record->start_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "end_date") == 0) {
            strcpy(record->end_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "monday") == 0) {
            record->monday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "tuesday") == 0) {
            record->tuesday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "wednesday") == 0) {
            record->wednesday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "thursday") == 0) {
            record->thursday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "friday") == 0) {
            record->friday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "saturday") == 0) {
            record->saturday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "sunday") == 0) {
            record->sunday = parse_service_availability(field_values[i]);
            continue;
        }
    }
}